

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

int __thiscall Threadpool<Searchthread>::init(Threadpool<Searchthread> *this,EVP_PKEY_CTX *ctx)

{
  Searchthread *this_00;
  Threadpool<Searchthread> *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  function<void_()> local_48;
  Searchthread *local_28;
  uint local_1c;
  EVP_PKEY_CTX *pEStack_18;
  uint i;
  int *numThreads_local;
  Threadpool<Searchthread> *this_local;
  
  pEStack_18 = ctx;
  numThreads_local = (int *)this;
  exit(this,(int)ctx);
  std::vector<Searchthread_*,_std::allocator<Searchthread_*>_>::clear(&this->workers);
  std::__atomic_base<unsigned_int>::operator=(&(this->busy).super___atomic_base<unsigned_int>,0);
  std::__atomic_base<unsigned_int>::operator=
            (&(this->processed).super___atomic_base<unsigned_int>,0);
  std::atomic<bool>::operator=(&this->stop,false);
  this->num_threads = *(uint *)pEStack_18;
  for (local_1c = 0; local_1c < this->num_threads; local_1c = local_1c + 1) {
    this_00 = (Searchthread *)operator_new(0x70);
    local_70 = thread_func;
    local_68 = 0;
    local_78 = this;
    std::bind<void(Threadpool<Searchthread>::*)(),Threadpool<Searchthread>*>
              (&local_60,(offset_in_Threadpool<Searchthread>_to_subr *)&local_70,&local_78);
    std::function<void()>::
    function<std::_Bind<void(Threadpool<Searchthread>::*(Threadpool<Searchthread>*))()>,void>
              ((function<void()> *)&local_48,&local_60);
    Searchthread::Searchthread(this_00,&local_48);
    local_28 = this_00;
    std::vector<Searchthread*,std::allocator<Searchthread*>>::emplace_back<Searchthread*>
              ((vector<Searchthread*,std::allocator<Searchthread*>> *)this,&local_28);
    std::function<void_()>::~function(&local_48);
  }
  return local_1c;
}

Assistant:

void init(const int& numThreads) {

		// Clear any existing work..
		exit();
		workers.clear();

		busy = 0;
		processed = 0;
		stop = false;
		num_threads = numThreads;

		for (unsigned int i = 0; i < num_threads; ++i)
			workers.emplace_back(new T(std::bind(&Threadpool<T>::thread_func, this)));
	}